

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O1

uintptr_t __thiscall pstack::Procman::StackFrame::getFrameBase(StackFrame *this,Process *p)

{
  DIE *pDVar1;
  Addr reloc;
  undefined1 auStack_c8 [8];
  ExpressionStack stack;
  undefined1 local_68 [8];
  Attribute base;
  long local_40;
  undefined1 local_38 [8];
  ProcessLocation location;
  
  scopeIP((ProcessLocation *)local_38,this,p);
  if (location.location_ == 0) {
    pDVar1 = (DIE *)&Dwarf::DIE::null;
  }
  else {
    pDVar1 = CodeLocation::die((CodeLocation *)location.location_);
  }
  if ((pDVar1->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    pstack::Dwarf::DIE::attribute((AttrName)local_68,SUB81(pDVar1,0));
    if (local_40 != 0) {
      stack.super_stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>.c
      .super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      stack.super_stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>.c
      .super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      stack.super_stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>.c
      .super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      stack.super_stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>.c
      .super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      stack.super_stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>.c
      .super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      stack.super_stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>.c
      .super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      stack.super_stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>.c
      .super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_map_size = 0;
      stack.super_stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>.c
      .super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      auStack_c8 = (undefined1  [8])0x0;
      stack.super_stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>.c
      .super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_c8,0);
      stack.super_stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>.c
      .super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node._0_1_ = 0;
      if (location.location_ == 0) {
        reloc = 0;
      }
      else {
        reloc = (long)local_38 - *(long *)location.location_;
      }
      this = (StackFrame *)
             ExpressionStack::eval((ExpressionStack *)auStack_c8,p,(Attribute *)local_68,this,reloc)
      ;
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_c8);
    }
    Dwarf::DIE::~DIE((DIE *)local_68);
    if (local_40 != 0) goto LAB_0012e996;
  }
  this = (StackFrame *)0x0;
LAB_0012e996:
  if (location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               location.codeloc.
               super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  return (uintptr_t)this;
}

Assistant:

uintptr_t
StackFrame::getFrameBase(Process &p) const
{
    ProcessLocation location = scopeIP(p);
    const Dwarf::DIE &f = location.die();
    if (f) {
        auto base = f.attribute(Dwarf::DW_AT_frame_base);
        if (base.valid()) {
            ExpressionStack stack;
            return stack.eval(p, base, this, location.elfReloc());
        }
    }
    return 0;
}